

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::CheckAndSetOutParamMaxDepth(FunctionBody *this,RegSlot cOutParamsDepth)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint32 val;
  
  if (this->m_DEBUG_executionCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x514,"(m_DEBUG_executionCount == 0)",
                                "Function cannot be executing when modified");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  val = 8;
  if (8 < cOutParamsDepth) {
    val = cOutParamsDepth;
  }
  if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 10 & 1) ==
      0) {
    val = cOutParamsDepth;
  }
  SetCountField(this,OutParamMaxDepth,val);
  return;
}

Assistant:

void
    FunctionBody::CheckAndSetOutParamMaxDepth(RegSlot cOutParamsDepth)
    {
        CheckNotExecuting();
        SetOutParamMaxDepth(cOutParamsDepth);
    }